

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_arc_to
               (nk_draw_list *list,nk_vec2 center,float radius,float a_min,float a_max,uint segments
               )

{
  nk_vec2 pos;
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_28;
  float fStack_24;
  
  if (list != (nk_draw_list *)0x0) {
    if ((radius != 0.0) || (NAN(radius))) {
      fVar4 = (a_max - a_min) / (float)segments;
      fVar5 = ((((((fVar4 * 0.00013823564 + -0.0030399605) * fVar4 + 0.02080266) * fVar4 +
                 -0.02673534) * fVar4 + -0.13807878) * fVar4 + -0.012127613) * fVar4 + 1.0008676) *
              fVar4 + 1.910593e-31;
      fVar6 = ((((((fVar4 * -5.2302214e-14 + 0.000990141) * fVar4 + -0.018663716) * fVar4 +
                 0.1071238) * fVar4 + -0.11813404) * fVar4 + -0.39438233) * fVar4 + -0.038191997) *
              fVar4 + 1.002386;
      fVar4 = radius * (((((((a_min * -5.2302214e-14 + 0.000990141) * a_min + -0.018663716) * a_min
                           + 0.1071238) * a_min + -0.11813404) * a_min + -0.39438233) * a_min +
                        -0.038191997) * a_min + 1.002386);
      fVar2 = radius * (((((((a_min * 0.00013823564 + -0.0030399605) * a_min + 0.02080266) * a_min +
                           -0.02673534) * a_min + -0.13807878) * a_min + -0.012127613) * a_min +
                        1.0008676) * a_min + 1.910593e-31);
      for (uVar1 = 0; uVar1 <= segments; uVar1 = uVar1 + 1) {
        local_28 = center.x;
        fStack_24 = center.y;
        pos.y = fVar2 + fStack_24;
        pos.x = fVar4 + local_28;
        nk_draw_list_path_line_to(list,pos);
        fVar3 = fVar4 * fVar5;
        fVar4 = fVar4 * fVar6 + -fVar2 * fVar5;
        fVar2 = fVar2 * fVar6 + fVar3;
      }
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x2198,
                "void nk_draw_list_path_arc_to(struct nk_draw_list *, struct nk_vec2, float, float, float, unsigned int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_arc_to(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, float a_min, float a_max, unsigned int segments)
{
    unsigned int i = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (radius == 0.0f) return;

    /*  This algorithm for arc drawing relies on these two trigonometric identities[1]:
            sin(a + b) = sin(a) * cos(b) + cos(a) * sin(b)
            cos(a + b) = cos(a) * cos(b) - sin(a) * sin(b)

        Two coordinates (x, y) of a point on a circle centered on
        the origin can be written in polar form as:
            x = r * cos(a)
            y = r * sin(a)
        where r is the radius of the circle,
            a is the angle between (x, y) and the origin.

        This allows us to rotate the coordinates around the
        origin by an angle b using the following transformation:
            x' = r * cos(a + b) = x * cos(b) - y * sin(b)
            y' = r * sin(a + b) = y * cos(b) + x * sin(b)

        [1] https://en.wikipedia.org/wiki/List_of_trigonometric_identities#Angle_sum_and_difference_identities
    */
    {const float d_angle = (a_max - a_min) / (float)segments;
    const float sin_d = (float)NK_SIN(d_angle);
    const float cos_d = (float)NK_COS(d_angle);

    float cx = (float)NK_COS(a_min) * radius;
    float cy = (float)NK_SIN(a_min) * radius;
    for(i = 0; i <= segments; ++i) {
        float new_cx, new_cy;
        const float x = center.x + cx;
        const float y = center.y + cy;
        nk_draw_list_path_line_to(list, nk_vec2(x, y));

        new_cx = cx * cos_d - cy * sin_d;
        new_cy = cy * cos_d + cx * sin_d;
        cx = new_cx;
        cy = new_cy;
    }}
}